

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void check_mkstemp_result(uv_fs_t *req)

{
  int iVar1;
  size_t sVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if (req->fs_type == UV_FS_MKSTEMP) {
    if (req->result < 0) {
      pcVar4 = "req->result >= 0";
      uVar3 = 0x22c;
    }
    else {
      pcVar4 = req->path;
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "req->path";
        uVar3 = 0x22d;
      }
      else {
        sVar2 = strlen(pcVar4);
        if (sVar2 == 0x10) {
          iVar1 = bcmp(pcVar4,"test_file_",10);
          if (iVar1 == 0) {
            iVar1 = bcmp(pcVar4 + 10,"XXXXXX",6);
            if (iVar1 == 0) {
              pcVar4 = "memcmp(req->path + 10, \"XXXXXX\", 6) != 0";
              uVar3 = 0x230;
            }
            else {
              check_permission(pcVar4,0x180);
              iVar1 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,req->path,(uv_fs_cb)0x0);
              if (iVar1 == 0) {
                if ((stat_req.statbuf.st_mode._1_1_ & 0x80) != 0) {
                  uv_fs_req_cleanup(&stat_req);
                  return;
                }
                pcVar4 = "stat_req.statbuf.st_mode & S_IFREG";
                uVar3 = 0x236;
              }
              else {
                pcVar4 = "r == 0";
                uVar3 = 0x235;
              }
            }
          }
          else {
            pcVar4 = "memcmp(req->path, \"test_file_\", 10) == 0";
            uVar3 = 0x22f;
          }
        }
        else {
          pcVar4 = "strlen(req->path) == 16";
          uVar3 = 0x22e;
        }
      }
    }
  }
  else {
    pcVar4 = "req->fs_type == UV_FS_MKSTEMP";
    uVar3 = 0x22b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

static void check_mkstemp_result(uv_fs_t* req) {
  int r;

  ASSERT(req->fs_type == UV_FS_MKSTEMP);
  ASSERT(req->result >= 0);
  ASSERT(req->path);
  ASSERT(strlen(req->path) == 16);
  ASSERT(memcmp(req->path, "test_file_", 10) == 0);
  ASSERT(memcmp(req->path + 10, "XXXXXX", 6) != 0);
  check_permission(req->path, 0600);

  /* Check if req->path is actually a file */
  r = uv_fs_stat(NULL, &stat_req, req->path, NULL);
  ASSERT(r == 0);
  ASSERT(stat_req.statbuf.st_mode & S_IFREG);
  uv_fs_req_cleanup(&stat_req);
}